

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tunnel.c
# Opt level: O0

void on_write_complete(h2o_socket_t *sock,char *err)

{
  h2o_http2_conn_t *conn_00;
  h2o_context_t *phVar1;
  h2o_linklist_t *node;
  int iVar2;
  st_h2o_linklist_t **stream_00;
  h2o_http2_stream_t *stream;
  h2o_http2_conn_t *conn;
  char *err_local;
  h2o_socket_t *sock_local;
  
  conn_00 = (h2o_http2_conn_t *)sock->data;
  if ((conn_00->_write).buf_in_flight == (h2o_buffer_t *)0x0) {
    __assert_fail("conn->_write.buf_in_flight != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/http2/connection.c"
                  ,0x3d0,"void on_write_complete(h2o_socket_t *, const char *)");
  }
  if (err == (char *)0x0) {
    h2o_buffer_dispose(&(conn_00->_write).buf_in_flight);
    if ((conn_00->_write).buf_in_flight != (h2o_buffer_t *)0x0) {
      __assert_fail("conn->_write.buf_in_flight == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/http2/connection.c"
                    ,0x3db,"void on_write_complete(h2o_socket_t *, const char *)");
    }
    if (conn_00->state < H2O_HTTP2_CONN_STATE_IS_CLOSING) {
      while (iVar2 = h2o_linklist_is_empty(&(conn_00->_write).streams_to_proceed), iVar2 == 0) {
        node = (conn_00->_write).streams_to_proceed.next;
        stream_00 = &node[-10].prev;
        iVar2 = h2o_http2_stream_has_pending_data((h2o_http2_stream_t *)stream_00);
        if (iVar2 != 0) {
          __assert_fail("!h2o_http2_stream_has_pending_data(stream)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/http2/connection.c"
                        ,0x3e2,"void on_write_complete(h2o_socket_t *, const char *)");
        }
        h2o_linklist_unlink(node);
        h2o_http2_stream_proceed(conn_00,(h2o_http2_stream_t *)stream_00);
      }
    }
    iVar2 = h2o_timeout_is_linked(&(conn_00->_write).timeout_entry);
    if (iVar2 != 0) {
      h2o_timeout_unlink(&(conn_00->_write).timeout_entry);
    }
    if (conn_00->state == H2O_HTTP2_CONN_STATE_OPEN) {
      if ((((conn_00->_write).buf)->size != 0) ||
         (iVar2 = h2o_http2_scheduler_is_active(&conn_00->scheduler), iVar2 != 0)) {
        h2o_socket_notify_write(sock,on_notify_write);
      }
    }
    else {
      do_emit_writereq(conn_00);
    }
  }
  else {
    phVar1 = (conn_00->super).ctx;
    (phVar1->http2).events.write_closed = (phVar1->http2).events.write_closed + 1;
    close_connection_now(conn_00);
  }
  return;
}

Assistant:

static void on_write_complete(h2o_socket_t *sock, const char *err)
{
    struct st_h2o_tunnel_t *tunnel = sock->data;
    h2o_socket_t *peer;
    assert(tunnel != NULL);
    assert(tunnel->sock[0] == sock || tunnel->sock[1] == sock);

    if (err != NULL) {
        close_connection(tunnel);
        return;
    }

    reset_timeout(tunnel);

    if (tunnel->sock[0] == sock)
        peer = tunnel->sock[1];
    else
        peer = tunnel->sock[0];

    h2o_buffer_consume(&peer->input, peer->input->size);
    h2o_socket_read_start(peer, on_read);
}